

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void dumpU32(uint32_t value,bool inArray)

{
  byte in_SIL;
  uint in_EDI;
  uint8_t v;
  int i;
  int local_c;
  
  for (local_c = 0x18; -1 < local_c; local_c = local_c + -8) {
    printf("%02hhx ",(ulong)(byte)(in_EDI >> ((byte)local_c & 0x1f)));
  }
  printf("            ");
  if ((in_SIL & 1) != 0) {
    printf(" ");
  }
  return;
}

Assistant:

void dumpU32(uint32_t value, bool inArray = false)
{
	for (int i = 24; i >= 0; i -= 8)
	{
		uint8_t v;
		v = (value >> i) & 0xff;
		printf("%02hhx ", v);
	}
	printf("            ");
	if (inArray)
	{
		printf(" ");
	}
}